

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_socket.c
# Opt level: O0

int qc_socket_close(QcSocket *socket)

{
  int iVar1;
  QcSocket *socket_local;
  
  if (socket != (QcSocket *)0x0) {
    iVar1 = close(socket->sockfd);
    if (iVar1 == 0) {
      free(socket);
      socket_local._4_4_ = 0;
    }
    else {
      _qc_error("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
                ,0x51,"socket destroy failed");
      socket_local._4_4_ = -1;
    }
    return socket_local._4_4_;
  }
  fprintf(_stderr,"stderr: assert throw. [%s  line:%d]\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
          ,0x4d);
  __assert_fail("socket",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
                ,0x4d,"int qc_socket_close(QcSocket *)");
}

Assistant:

int qc_socket_close(QcSocket *socket)
{
    qc_assert(socket);

    if(0 != close(socket->sockfd))
    {
        qc_error("socket destroy failed");
        return -1;
    }

    qc_free(socket);
    socket = NULL;  /*confirm it should be NULL*/
    return 0;
}